

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O2

bool ZXing::OneD::IsCharacterPair(PatternView v,int modsLeft,int modsRight)

{
  bool bVar1;
  float modSizeRef;
  PatternView local_58;
  PatternView local_38;
  
  modSizeRef = DataBar::ModSizeFinder(&v);
  local_38._data = v._data;
  local_38._size = 8;
  local_38._base = v._base;
  local_38._end = v._end;
  bVar1 = DataBar::IsCharacter(&local_38,modsLeft,modSizeRef);
  if (bVar1) {
    local_58._data = v._data + 0xd;
    local_58._size = 8;
    local_58._base = v._base;
    local_58._end = v._end;
    bVar1 = DataBar::IsCharacter(&local_58,modsRight,modSizeRef);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool IsCharacterPair(PatternView v, int modsLeft, int modsRight)
{
	float modSizeRef = ModSizeFinder(v);
	return IsCharacter(LeftChar(v), modsLeft, modSizeRef) && IsCharacter(RightChar(v), modsRight, modSizeRef);
}